

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

Logger * el::Loggers::reconfigureLogger
                   (string *identity,ConfigurationType configurationType,string *value)

{
  Logger *this;
  Configurations *this_00;
  
  this = base::RegisteredLoggers::get(*(RegisteredLoggers **)(base::elStorage + 0x10),identity,true)
  ;
  if (this != (Logger *)0x0) {
    this_00 = &this->m_configurations;
    (*(this->m_configurations).
      super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[2])(this_00);
    Configurations::unsafeSet(this_00,Global,configurationType,value);
    Configurations::unsafeSetGlobally(this_00,configurationType,value,false);
    Logger::configure(this,this_00);
  }
  return this;
}

Assistant:

Logger* Loggers::reconfigureLogger(const std::string& identity, ConfigurationType configurationType,
                                   const std::string& value) {
  Logger* logger = Loggers::getLogger(identity);
  if (logger == nullptr) {
    return nullptr;
  }
  logger->configurations()->set(Level::Global, configurationType, value);
  logger->reconfigure();
  return logger;
}